

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O3

void __thiscall toml::detail::location::retrace(location *this)

{
  long lVar1;
  size_t sVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  prev;
  long local_28;
  long local_20;
  long local_18;
  
  sVar2 = this->location_;
  if (sVar2 == 0) {
    this->line_number_ = 1;
    sVar2 = 1;
  }
  else {
    this->location_ = sVar2 - 1;
    local_20 = (long)(((this->source_).
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
    if (*(char *)(local_20 + -1 + sVar2) != '\n') {
      return;
    }
    this->line_number_ = this->line_number_ - 1;
    lVar1 = local_20 + sVar2 + -1;
    local_18 = lVar1;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
              (&local_28);
    sVar2 = (lVar1 - local_28) + 1;
  }
  this->column_number_ = sVar2;
  return;
}

Assistant:

TOML11_INLINE void location::retrace(/*restricted to n=1*/) noexcept
{
    assert(this->is_ok());
    if(this->location_ == 0)
    {
        this->location_ = 0;
        this->line_number_ = 1;
        this->column_number_ = 1;
    }
    else
    {
        this->retrace_impl();
    }
}